

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_function.hpp
# Opt level: O2

void __thiscall duckdb::CopyFunction::CopyFunction(CopyFunction *this,CopyFunction *param_1)

{
  Function::Function(&this->super_Function,&param_1->super_Function);
  (this->super_Function)._vptr_Function = (_func_int **)&PTR__CopyFunction_0278dfb8;
  switchD_016b0717::default(&this->plan,&param_1->plan,0x90);
  TableFunction::TableFunction(&this->copy_from_function,&param_1->copy_from_function);
  ::std::__cxx11::string::string((string *)&this->extension,(string *)&param_1->extension);
  return;
}

Assistant:

explicit CopyFunction(const string &name)
	    : Function(name), plan(nullptr), copy_to_select(nullptr), copy_to_bind(nullptr),
	      copy_to_initialize_local(nullptr), copy_to_initialize_global(nullptr),
	      copy_to_get_written_statistics(nullptr), copy_to_sink(nullptr), copy_to_combine(nullptr),
	      copy_to_finalize(nullptr), execution_mode(nullptr), prepare_batch(nullptr), flush_batch(nullptr),
	      desired_batch_size(nullptr), rotate_files(nullptr), rotate_next_file(nullptr), serialize(nullptr),
	      deserialize(nullptr), copy_from_bind(nullptr) {
	}